

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha_test.cc
# Opt level: O1

void __thiscall SHATest_SHA512ABI_Test::TestBody(SHATest_SHA512ABI_Test *this)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  long lVar4;
  int local_118 [4];
  SHA512_CTX ctx;
  
  SHA512_Init((SHA512_CTX *)&ctx);
  local_118[0] = 1;
  local_118[1] = 2;
  local_118[2] = 3;
  local_118[3] = 4;
  uVar2 = OPENSSL_get_ia32cap(1);
  lVar4 = 0;
  do {
    iVar1 = *(int *)((long)local_118 + lVar4);
    if ((uVar2 >> 0x1c & 1) != 0) {
      uVar3 = OPENSSL_get_ia32cap(0);
      if ((uVar3 >> 0x1e & 1) != 0) {
        abi_test::internal::CheckGTest<void,unsigned_long*,unsigned_char_const*,unsigned_long>
                  ("sha512_block_data_order_avx, ctx.h, kBuf, blocks",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/sha/sha_test.cc"
                   ,0x8a,true,sha512_block_data_order_avx,ctx.h,"",(long)iVar1);
      }
    }
    abi_test::internal::CheckGTest<void,unsigned_long*,unsigned_char_const*,unsigned_long>
              ("sha512_block_data_order_nohw, ctx.h, kBuf, blocks",
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/sha/sha_test.cc"
               ,0x93,true,sha512_block_data_order_nohw,ctx.h,"",(long)iVar1);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x10);
  return;
}

Assistant:

TEST(SHATest, SHA512ABI) {
  SHA512_CTX ctx;
  SHA512_Init(&ctx);

  static const uint8_t kBuf[SHA512_CBLOCK * 4] = {0};
  for (size_t blocks : {1, 2, 3, 4}) {
#if defined(SHA512_ASM)
    CHECK_ABI(sha512_block_data_order, ctx.h, kBuf, blocks);
#endif
#if defined(SHA512_ASM_HW)
    if (sha512_hw_capable()) {
      CHECK_ABI(sha512_block_data_order_hw, ctx.h, kBuf, blocks);
    }
#endif
#if defined(SHA512_ASM_AVX)
    if (sha512_avx_capable()) {
      CHECK_ABI(sha512_block_data_order_avx, ctx.h, kBuf, blocks);
    }
#endif
#if defined(SHA512_ASM_NEON)
    if (CRYPTO_is_NEON_capable()) {
      CHECK_ABI(sha512_block_data_order_neon, ctx.h, kBuf, blocks);
    }
#endif
#if defined(SHA512_ASM_NOHW)
    CHECK_ABI(sha512_block_data_order_nohw, ctx.h, kBuf, blocks);
#endif
  }
}